

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall
duckdb::DictionaryCompressionCompressState::AddNewString
          (DictionaryCompressionCompressState *this,string_t str)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  BlockManager *pBVar2;
  iterator iVar3;
  StringDictionaryContainer SVar4;
  uint uVar5;
  pointer pCVar6;
  type pCVar7;
  undefined8 uVar8;
  uint *puVar9;
  char *__dest;
  anon_union_16_2_67f50693_for_value local_48;
  uint local_38;
  char acStack_34 [4];
  char *pcStack_30;
  int local_28;
  
  local_48.pointer.ptr = (char *)str.value._8_8_;
  local_48._0_8_ = str.value._0_8_;
  this_00 = &this->current_segment;
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  StringStats::Update(&(pCVar6->stats).statistics,(string_t *)&local_48.pointer);
  uVar5 = (this->current_dictionary).size + local_48.pointer.length;
  __dest = (char *)(this->current_end_ptr + -(ulong)uVar5);
  (this->current_dictionary).size = uVar5;
  uVar8 = local_48.pointer.ptr;
  if ((local_48._0_8_ & 0xffffffff) < 0xd) {
    uVar8 = local_48.pointer.prefix;
  }
  switchD_015de399::default(__dest,(void *)uVar8,local_48._0_8_ & 0xffffffff);
  pBVar2 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
  optional_idx::GetIndex(&pBVar2->block_alloc_size);
  optional_idx::GetIndex(&pBVar2->block_header_size);
  iVar3._M_current =
       (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->index_buffer,iVar3,
               &(this->current_dictionary).size);
    puVar9 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (this->current_dictionary).size;
    puVar9 = iVar3._M_current + 1;
    (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar9;
  }
  local_38 = (int)((ulong)((long)puVar9 -
                          (long)(this->index_buffer).
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
  iVar3._M_current =
       (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&(this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  uVar8 = local_48._0_8_;
  if ((uint)local_48._0_4_ < 0xd) {
    acStack_34[0] = local_48.pointer.prefix[0];
    acStack_34[1] = local_48.pointer.prefix[1];
    acStack_34[2] = local_48.pointer.prefix[2];
    acStack_34[3] = local_48.pointer.prefix[3];
    local_28 = (int)((ulong)((long)(this->index_buffer).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->index_buffer).
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
    pcStack_30 = local_48.pointer.ptr;
  }
  else {
    acStack_34 = *(char (*) [4])__dest;
    local_28 = (int)((ulong)((long)(this->index_buffer).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->index_buffer).
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
    pcStack_30 = __dest;
  }
  local_28 = local_28 + -1;
  local_38 = local_48.pointer.length;
  local_48._0_8_ = uVar8;
  ::std::
  _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_int>,std::allocator<std::pair<duckdb::string_t_const,unsigned_int>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<duckdb::string_t_const,unsigned_int>>
            ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_int>,std::allocator<std::pair<duckdb::string_t_const,unsigned_int>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->current_string_map);
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator*(this_00);
  SVar4 = this->current_dictionary;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->current_handle).node);
  *(StringDictionaryContainer *)(((this->current_handle).node.ptr)->buffer + pCVar7->offset) = SVar4
  ;
  this->current_width = this->next_width;
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void DictionaryCompressionCompressState::AddNewString(string_t str) {
	UncompressedStringStorage::UpdateStringStats(current_segment->stats, str);

	// Copy string to dict
	current_dictionary.size += str.GetSize();
	auto dict_pos = current_end_ptr - current_dictionary.size;
	memcpy(dict_pos, str.GetData(), str.GetSize());
	current_dictionary.Verify(info.GetBlockSize());
	D_ASSERT(current_dictionary.end == info.GetBlockSize());

	// Update buffers and map
	index_buffer.push_back(current_dictionary.size);
	selection_buffer.push_back(UnsafeNumericCast<uint32_t>(index_buffer.size() - 1));
	if (str.IsInlined()) {
		current_string_map.insert({str, index_buffer.size() - 1});
	} else {
		string_t dictionary_string((const char *)dict_pos, UnsafeNumericCast<uint32_t>(str.GetSize())); // NOLINT
		D_ASSERT(!dictionary_string.IsInlined());
		current_string_map.insert({dictionary_string, index_buffer.size() - 1});
	}
	DictionaryCompression::SetDictionary(*current_segment, current_handle, current_dictionary);

	current_width = next_width;
	current_segment->count++;
}